

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O3

char * snvis(char *mbdst,size_t dlen,wchar_t c,wchar_t flags,wchar_t nextc,char *mbextra)

{
  wchar_t wVar1;
  char *pcVar2;
  char cc [2];
  char local_22;
  undefined1 local_21;
  size_t local_20;
  char *local_18;
  
  local_22 = (char)c;
  local_21 = (undefined1)nextc;
  local_20 = dlen;
  local_18 = mbdst;
  wVar1 = istrsenvisx(&local_18,&local_20,&local_22,1,flags,mbextra,(wchar_t *)0x0);
  pcVar2 = local_18 + (uint)wVar1;
  if (wVar1 < L'\0') {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *
snvis(char *mbdst, size_t dlen, int c, int flags, int nextc, const char *mbextra)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, &dlen, cc, 1, flags, mbextra, NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}